

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Parser.h
# Opt level: O3

Statement * __thiscall soul::StructuralParser::parseForLoop(StructuralParser *this)

{
  Scope *pSVar1;
  char *pcVar2;
  bool bVar3;
  Block *pBVar4;
  SourceCodeText *pSVar5;
  SourceCodeText *pSVar6;
  pool_ptr<soul::AST::Expression> pVar7;
  VariableDeclaration *pVVar8;
  Expression *pEVar9;
  Statement *pSVar10;
  Context local_88;
  undefined1 local_70 [16];
  StructurePtr local_60;
  
  Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
  ::expect<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x27f6d5);
  local_70._0_8_ = (this->super_SOULTokeniser).location.sourceCode.object;
  if ((SourceCodeText *)local_70._0_8_ != (SourceCodeText *)0x0) {
    (((SourceCodeText *)local_70._0_8_)->super_RefCountedObject).refCount =
         (((SourceCodeText *)local_70._0_8_)->super_RefCountedObject).refCount + 1;
  }
  local_70._8_8_ = (this->super_SOULTokeniser).location.location.data;
  local_60.object = (Structure *)this->currentScope;
  local_88.location.sourceCode.object = (SourceCodeText *)0x0;
  pBVar4 = PoolAllocator::allocate<soul::AST::Block,soul::AST::Context,decltype(nullptr)>
                     (&this->allocator->pool,(Context *)local_70,(void **)&local_88);
  RefCountedPtr<soul::SourceCodeText>::decIfNotNull((SourceCodeText *)local_70._0_8_);
  local_60.object = (Structure *)&pBVar4->super_Scope;
  pSVar1 = this->currentScope;
  this->currentScope = (Scope *)local_60.object;
  local_70._0_8_ = (this->super_SOULTokeniser).location.sourceCode.object;
  if ((SourceCodeText *)local_70._0_8_ != (SourceCodeText *)0x0) {
    (((SourceCodeText *)local_70._0_8_)->super_RefCountedObject).refCount =
         (((SourceCodeText *)local_70._0_8_)->super_RefCountedObject).refCount + 1;
  }
  local_70._8_8_ = (this->super_SOULTokeniser).location.location.data;
  pSVar5 = (SourceCodeText *)
           PoolAllocator::allocate<soul::AST::LoopStatement,soul::AST::Context>
                     (&this->allocator->pool,(Context *)local_70);
  RefCountedPtr<soul::SourceCodeText>::decIfNotNull((SourceCodeText *)local_70._0_8_);
  pSVar6 = (SourceCodeText *)parseStatement(this);
  local_70._0_8_ = pSVar6;
  std::
  vector<soul::pool_ref<soul::AST::Statement>,std::allocator<soul::pool_ref<soul::AST::Statement>>>
  ::emplace_back<soul::pool_ref<soul::AST::Statement>>
            ((vector<soul::pool_ref<soul::AST::Statement>,std::allocator<soul::pool_ref<soul::AST::Statement>>>
              *)&pBVar4->statements,(pool_ref<soul::AST::Statement> *)local_70);
  local_70._0_8_ = pSVar5;
  std::
  vector<soul::pool_ref<soul::AST::Statement>,std::allocator<soul::pool_ref<soul::AST::Statement>>>
  ::emplace_back<soul::pool_ref<soul::AST::Statement>>
            ((vector<soul::pool_ref<soul::AST::Statement>,std::allocator<soul::pool_ref<soul::AST::Statement>>>
              *)&pBVar4->statements,(pool_ref<soul::AST::Statement> *)local_70);
  pcVar2 = (this->super_SOULTokeniser).currentType.text;
  if ((pcVar2 == ")") || (((pcVar2 != (char *)0x0 && (*pcVar2 == ')')) && (pcVar2[1] == '\0')))) {
    pVVar8 = (VariableDeclaration *)
             __dynamic_cast(pSVar6,&AST::Statement::typeinfo,&AST::VariableDeclaration::typeinfo,0);
    if (pVVar8 == (VariableDeclaration *)0x0) {
      Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
      ::expect<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x2585e7);
    }
    else {
      (pSVar5->utf8).data = (char *)pVVar8;
      pVVar8->doNotConstantFold = true;
      Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
      ::skip(&this->super_SOULTokeniser);
    }
  }
  else {
    bVar3 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
            ::matchIf<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x2585e7);
    if (bVar3) {
      local_88.location.sourceCode.object = (SourceCodeText *)0x0;
      local_88.location.location.data = (char *)0x0;
      local_88.parentScope = (Scope *)0x0;
      soul::Value::Value((Value *)local_70,true);
      pVar7.object = &PoolAllocator::allocate<soul::AST::Constant,soul::AST::Context,soul::Value>
                                (&this->allocator->pool,&local_88,(Value *)local_70)->
                      super_Expression;
      (pSVar5->content).field_2._M_allocated_capacity = (size_type)pVar7.object;
      soul::Value::~Value((Value *)local_70);
      RefCountedPtr<soul::SourceCodeText>::decIfNotNull(local_88.location.sourceCode.object);
    }
    else {
      pVar7.object = parseExpression(this,false);
      Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
      ::expect<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x2585e7);
      (pSVar5->content).field_2._M_allocated_capacity = (size_type)pVar7.object;
    }
    bVar3 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
            ::matchIf<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x27d2c7);
    if (!bVar3) {
      pEVar9 = parseExpression(this,true);
      Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
      ::expect<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x27d2c7);
      (pSVar5->content)._M_dataplus._M_p = (pointer)pEVar9;
    }
  }
  pSVar10 = parseStatement(this);
  ((pool_ptr<soul::AST::Statement> *)&(pSVar5->content)._M_string_length)->object = pSVar10;
  this->currentScope = pSVar1;
  return &pBVar4->super_Statement;
}

Assistant:

AST::Statement& parseForLoop()
    {
        expect (Operator::openParen);
        auto& block = allocate<AST::Block> (getContext(), nullptr);
        ScopedScope scope (*this, block);
        auto& loopStatement = allocate<AST::LoopStatement> (getContext());
        auto& loopInitialiser = parseStatement();
        block.addStatement (loopInitialiser);
        block.addStatement (loopStatement);

        if (matches (Operator::closeParen))
        {
            if (auto v = cast<AST::VariableDeclaration> (loopInitialiser))
            {
                loopStatement.rangeLoopInitialiser = v;
                v->doNotConstantFold = true;
                skip();
            }
            else
            {
                expect (Operator::semicolon);
            }
        }
        else
        {
            if (matchIf (Operator::semicolon))
                loopStatement.condition = allocate<AST::Constant> (AST::Context(), Value (true));
            else
                loopStatement.condition = matchEndOfStatement (parseExpression());

            if (! matchIf (Operator::closeParen))
                loopStatement.iterator = matchCloseParen (parseExpression (true));
        }

        loopStatement.body = parseStatement();
        return block;
    }